

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O1

void __thiscall xmrig::FailoverStrategy::add(FailoverStrategy *this,Pool *pool)

{
  pointer *pppIVar1;
  iterator __position;
  IClient *client;
  IClient *local_10;
  
  local_10 = Pool::createClient(pool,(int)((ulong)((long)(this->m_pools).
                                                                                                                  
                                                  super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->m_pools).
                                                                                                                
                                                  super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
                                &this->super_IClientListener);
  (*local_10->_vptr_IClient[0x17])(local_10,(ulong)(uint)this->m_retries);
  (*local_10->_vptr_IClient[0x18])(local_10,(long)this->m_retryPause * 1000);
  (*local_10->_vptr_IClient[0x16])(local_10,(ulong)this->m_quiet);
  __position._M_current =
       (this->m_pools).super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_pools).super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<xmrig::IClient*,std::allocator<xmrig::IClient*>>::
    _M_realloc_insert<xmrig::IClient*const&>
              ((vector<xmrig::IClient*,std::allocator<xmrig::IClient*>> *)&this->m_pools,__position,
               &local_10);
  }
  else {
    *__position._M_current = local_10;
    pppIVar1 = &(this->m_pools).
                super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  return;
}

Assistant:

void xmrig::FailoverStrategy::add(const Pool &pool)
{
    IClient *client = pool.createClient(static_cast<int>(m_pools.size()), this);

    client->setRetries(m_retries);
    client->setRetryPause(m_retryPause * 1000);
    client->setQuiet(m_quiet);

    m_pools.push_back(client);
}